

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_mesh.cpp
# Opt level: O0

ON_MeshComponentRef * __thiscall
ON_MeshTopology::MeshComponentRef
          (ON_MeshComponentRef *__return_storage_ptr__,ON_MeshTopology *this,ON_COMPONENT_INDEX ci)

{
  ON_MeshComponentRef local_48;
  undefined1 local_21;
  ON_MeshTopology *local_20;
  ON_MeshTopology *this_local;
  ON_COMPONENT_INDEX ci_local;
  ON_MeshComponentRef *cr;
  
  local_21 = 0;
  local_20 = this;
  this_local = (ON_MeshTopology *)ci;
  ci_local = (ON_COMPONENT_INDEX)__return_storage_ptr__;
  ON_MeshComponentRef::ON_MeshComponentRef(__return_storage_ptr__);
  if (this->m_mesh != (ON_Mesh *)0x0) {
    ON_Mesh::MeshComponentRef(&local_48,this->m_mesh,(ON_COMPONENT_INDEX)this_local);
    ON_MeshComponentRef::operator=(__return_storage_ptr__,&local_48);
    ON_MeshComponentRef::~ON_MeshComponentRef(&local_48);
  }
  return __return_storage_ptr__;
}

Assistant:

ON_MeshComponentRef ON_MeshTopology::MeshComponentRef(ON_COMPONENT_INDEX ci) const
{
  ON_MeshComponentRef cr;
  if ( 0 != m_mesh )
    cr = m_mesh->MeshComponentRef(ci);
  return cr;
}